

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadWireProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *file;
  char local_428 [8];
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Wire-Program}\n");
  fflush(_stdout);
  djgp_push_string(program_00,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  file = strcat2(local_428,g_app.dir.shader,"wire.glsl");
  djgp_push_file(program_00,file);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs + 3);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[0xe] = (*glad_glGetUniformLocation)(g_gl.programs[3],"u_InstanceCount");
    configureWireProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadWireProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_WIRE];
    char buf[1024];

    LOG("Loading {Wire-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "wire.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_WIRE_INSTANCE_COUNT] =
        glGetUniformLocation(g_gl.programs[PROGRAM_WIRE], "u_InstanceCount");

    configureWireProgram();

    return (glGetError() == GL_NO_ERROR);
}